

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O3

void ImNodes::BeginCanvas(CanvasState *canvas)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  bool bVar3;
  ImGuiID id;
  ImU32 col;
  ImDrawList *this;
  ImGuiIO *pIVar4;
  float fVar5;
  float fVar6;
  ImVec2 IVar7;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  ImVec2 local_a0;
  ImVec2 local_98;
  undefined8 uStack_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  ImVec4 local_78;
  undefined1 local_68 [16];
  ImVec2 local_58;
  undefined8 uStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  canvas->_impl->prev_canvas = gCanvas;
  pIVar1 = GImGui->CurrentWindow;
  gCanvas = canvas;
  pIVar1->WriteAccessed = true;
  ImGui::PushID(canvas);
  id = ImGui::GetID("canvas");
  ImGui::ItemAdd(&pIVar1->ContentsRegionRect,id,(ImRect *)0x0);
  this = ImGui::GetWindowDrawList();
  pIVar4 = ImGui::GetIO();
  bVar3 = ImGui::IsMouseDown(0);
  if ((!bVar3) && (bVar3 = ImGui::IsWindowHovered(0), bVar3)) {
    bVar3 = ImGui::IsMouseDragging(1,-1.0);
    if (bVar3) {
      IVar7.y = (canvas->offset).y + (pIVar4->MouseDelta).y;
      IVar7.x = (canvas->offset).x + (pIVar4->MouseDelta).x;
      canvas->offset = IVar7;
    }
    if (pIVar4->KeyShift == true) {
      if (pIVar4->KeyCtrl == false) {
        (canvas->offset).x = pIVar4->MouseWheel * 16.0 + (canvas->offset).x;
      }
    }
    else {
      fVar5 = pIVar4->MouseWheel;
      if (pIVar4->KeyCtrl == false) {
        (canvas->offset).y = fVar5 * 16.0 + (canvas->offset).y;
      }
      else {
        if ((fVar5 != 0.0) || (NAN(fVar5))) {
          fVar6 = fVar5 * canvas->zoom * 0.0625 + canvas->zoom;
          fVar5 = 3.0;
          if (fVar6 <= 3.0) {
            fVar5 = fVar6;
          }
          canvas->zoom = (float)(-(uint)(fVar6 < 0.3) & 0x3e99999a |
                                ~-(uint)(fVar6 < 0.3) & (uint)fVar5);
        }
        IVar7 = ImGui::GetMouseDragDelta(0,-1.0);
        IVar2.y = (canvas->offset).y + IVar7.y;
        IVar2.x = (canvas->offset).x + IVar7.x;
        canvas->offset = IVar2;
      }
    }
  }
  fVar5 = canvas->zoom * 64.0;
  local_98 = ImGui::GetWindowPos();
  uStack_90 = extraout_XMM0_Qb;
  local_58 = ImGui::GetWindowSize();
  local_78.x = canvas->colors[0].Value.x;
  local_78.y = canvas->colors[0].Value.y;
  local_78.z = canvas->colors[0].Value.z;
  local_78.w = canvas->colors[0].Value.w;
  uStack_50 = extraout_XMM0_Qb_00;
  col = ImGui::ColorConvertFloat4ToU32(&local_78);
  fVar6 = fmodf((canvas->offset).x,fVar5);
  local_48 = local_98.y;
  fStack_44 = local_98.y;
  fStack_40 = local_98.y;
  fStack_3c = local_98.y;
  if (local_58.x <= fVar6) {
    local_88 = local_58.y;
    fStack_84 = local_58.y;
    fStack_80 = local_58.y;
    fStack_7c = local_58.y;
  }
  else {
    local_68 = ZEXT416((uint)(local_98.y + 0.0));
    local_88 = local_58.y;
    fStack_84 = local_58.y;
    fStack_80 = local_58.y;
    fStack_7c = local_58.y;
    local_38 = local_58.y + local_98.y;
    fStack_34 = local_58.y;
    fStack_30 = local_58.y;
    fStack_2c = local_58.y;
    do {
      local_a0.x = local_98.x + fVar6;
      local_78.y = (float)local_68._0_4_;
      local_78.x = local_a0.x;
      local_a0.y = local_38;
      ImDrawList::AddLine(this,(ImVec2 *)&local_78,&local_a0,col,1.0);
      fVar6 = fVar6 + fVar5;
    } while (fVar6 < local_58.x);
  }
  fVar6 = fmodf((canvas->offset).y,fVar5);
  if (fVar6 < local_88) {
    local_68 = ZEXT416((uint)(local_98.x + 0.0));
    local_98.y = local_98.y + local_58.y;
    local_98.x = local_98.x + local_58.x;
    uStack_90 = CONCAT44(uStack_90._4_4_ + uStack_50._4_4_,(float)uStack_90 + (float)uStack_50);
    do {
      local_78.y = local_48 + fVar6;
      local_78.x = (float)local_68._0_4_;
      local_a0.y = local_48 + fVar6;
      local_a0.x = local_98.x;
      ImDrawList::AddLine(this,(ImVec2 *)&local_78,&local_a0,col,1.0);
      fVar6 = fVar6 + fVar5;
    } while (fVar6 < local_88);
  }
  ImGui::SetWindowFontScale(canvas->zoom);
  return;
}

Assistant:

void BeginCanvas(CanvasState* canvas)
{
    canvas->_impl->prev_canvas = gCanvas;
    gCanvas = canvas;
    const ImGuiWindow* w = ImGui::GetCurrentWindow();
    ImGui::PushID(canvas);

    ImGui::ItemAdd(w->ContentsRegionRect, ImGui::GetID("canvas"));

    ImDrawList* draw_list = ImGui::GetWindowDrawList();
    ImGuiIO& io = ImGui::GetIO();

    if (!ImGui::IsMouseDown(0) && ImGui::IsWindowHovered())
    {
        if (ImGui::IsMouseDragging(1))
            canvas->offset += io.MouseDelta;

        if (io.KeyShift && !io.KeyCtrl)
            canvas->offset.x += io.MouseWheel * 16.0f;

        if (!io.KeyShift && !io.KeyCtrl)
            canvas->offset.y += io.MouseWheel * 16.0f;

        if (!io.KeyShift && io.KeyCtrl)
        {
            if (io.MouseWheel != 0)
                canvas->zoom = ImClamp(canvas->zoom + io.MouseWheel * canvas->zoom / 16.f, 0.3f, 3.f);
            canvas->offset += ImGui::GetMouseDragDelta();
        }
    }

    const float grid = 64.0f * canvas->zoom;

    ImVec2 pos = ImGui::GetWindowPos();
    ImVec2 size = ImGui::GetWindowSize();

    ImU32 grid_color = ImColor(canvas->colors[ColCanvasLines]);
    for (float x = fmodf(canvas->offset.x, grid); x < size.x;)
    {
        draw_list->AddLine(ImVec2(x, 0) + pos, ImVec2(x, size.y) + pos, grid_color);
        x += grid;
    }

    for (float y = fmodf(canvas->offset.y, grid); y < size.y;)
    {
        draw_list->AddLine(ImVec2(0, y) + pos, ImVec2(size.x, y) + pos, grid_color);
        y += grid;
    }

    ImGui::SetWindowFontScale(canvas->zoom);
}